

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::CBufferMap<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CBufferMap<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  CallLogWrapper *this_00;
  GLboolean GVar1;
  long lVar2;
  void *pvVar3;
  DIResult *pDVar4;
  DILogger *pDVar5;
  uint in_R9D;
  uint in_stack_ffffffffffffedb0;
  CDataArray dataRef;
  int dataHeight;
  int dataWidth;
  DILogger local_1228;
  DIResult result;
  DILogger local_f20;
  DILogger local_da0;
  DILogger local_c20;
  DILogger local_aa0;
  DILogger local_920;
  DILogger local_7a0;
  DILogger local_620;
  DILogger local_4a0;
  DILogger local_320;
  DILogger local_1a0;
  
  DIResult::DIResult(&result);
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffer);
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DrawIndirectBase::getDataSize(&this->super_DrawIndirectBase,&dataWidth,&dataHeight);
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&dataRef,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)(uint)dataWidth,
             dataHeight,0x1e,0x32,in_R9D);
  glu::CallLogWrapper::glBufferData
            (this_00,0x8f3f,
             (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e8);
  lVar2 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                    (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
  DIResult::sub_result(&local_1a0,&result,lVar2);
  DILogger::~DILogger(&local_1a0);
  pvVar3 = glu::CallLogWrapper::glMapBuffer(this_00,0x8f3f,35000);
  if (pvVar3 == (void *)0x0) {
    DIResult::error(&local_1228,&result);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_1228,
               (char (*) [65])"glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_READ_ONLY) returned NULL");
    pDVar5 = &local_1228;
  }
  else {
    lVar2 = DrawIndirectBase::BufferCheck
                      ((DrawIndirectBase *)&dataRef,(CDataArray *)(ulong)(uint)dataWidth,dataHeight,
                       (uint)pvVar3,(void *)(ulong)(uint)dataWidth,dataHeight,0,
                       in_stack_ffffffffffffedb0,
                       (uint)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    DIResult::sub_result(&local_320,&result,lVar2);
    DILogger::~DILogger(&local_320);
    lVar2 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\x01',35000,1,0,
                       (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    DIResult::sub_result(&local_4a0,&result,lVar2);
    DILogger::~DILogger(&local_4a0);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
    if (GVar1 == '\0') {
      pDVar4 = &result;
      DIResult::error(&local_1228,pDVar4);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_1228,(char (*) [75])pDVar4);
      DILogger::~DILogger(&local_1228);
    }
    lVar2 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_620,&result,lVar2);
    pDVar5 = &local_620;
  }
  DILogger::~DILogger(pDVar5);
  pvVar3 = glu::CallLogWrapper::glMapBuffer(this_00,0x8f3f,0x88b9);
  if (pvVar3 == (void *)0x0) {
    DIResult::error(&local_1228,&result);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_1228,
               (char (*) [66])"glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_WRITE_ONLY) returned NULL");
    pDVar5 = &local_1228;
  }
  else {
    lVar2 = DrawIndirectBase::BufferCheck
                      ((DrawIndirectBase *)&dataRef,(CDataArray *)(ulong)(uint)dataWidth,dataHeight,
                       (uint)pvVar3,(void *)(ulong)(uint)dataWidth,dataHeight,0,
                       in_stack_ffffffffffffedb0,
                       (uint)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    DIResult::sub_result(&local_7a0,&result,lVar2);
    DILogger::~DILogger(&local_7a0);
    lVar2 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\x01',0x88b9,2,0,
                       (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    DIResult::sub_result(&local_920,&result,lVar2);
    DILogger::~DILogger(&local_920);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
    if (GVar1 != '\x01') {
      pDVar4 = &result;
      DIResult::error(&local_1228,pDVar4);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_1228,(char (*) [75])pDVar4);
      DILogger::~DILogger(&local_1228);
    }
    lVar2 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_aa0,&result,lVar2);
    pDVar5 = &local_aa0;
  }
  DILogger::~DILogger(pDVar5);
  pvVar3 = glu::CallLogWrapper::glMapBuffer(this_00,0x8f3f,0x88ba);
  if (pvVar3 == (void *)0x0) {
    DIResult::error(&local_1228,&result);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&local_1228,
               (char (*) [66])"glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_READ_WRITE) returned NULL");
    pDVar5 = &local_1228;
  }
  else {
    lVar2 = DrawIndirectBase::BufferCheck
                      ((DrawIndirectBase *)&dataRef,(CDataArray *)(ulong)(uint)dataWidth,dataHeight,
                       (uint)pvVar3,(void *)(ulong)(uint)dataWidth,dataHeight,0,
                       in_stack_ffffffffffffedb0,
                       (uint)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    DIResult::sub_result(&local_c20,&result,lVar2);
    DILogger::~DILogger(&local_c20);
    lVar2 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\x01',0x88ba,3,0,
                       (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start);
    DIResult::sub_result(&local_da0,&result,lVar2);
    DILogger::~DILogger(&local_da0);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer(this_00,0x8f3f);
    if (GVar1 == '\0') {
      pDVar4 = &result;
      DIResult::error(&local_1228,pDVar4);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&local_1228,(char (*) [75])pDVar4);
      DILogger::~DILogger(&local_1228);
    }
    lVar2 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_f20,&result,lVar2);
    pDVar5 = &local_f20;
  }
  DILogger::~DILogger(pDVar5);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  DILogger::~DILogger(&result.logger_);
  return result.status_;
}

Assistant:

virtual long Run()
	{
		DIResult result;

		api::GL_Only();

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffer);

		CDataArray dataRef;
		int		   dataWidth, dataHeight;
		getDataSize(dataWidth, dataHeight);
		DataGen<unsigned int>(dataRef, dataWidth, dataHeight, 30, 50);
		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)), &dataRef[0],
					 GL_DYNAMIC_DRAW);

		result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));

		void* buf = glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_READ_ONLY);
		if (buf == 0)
		{
			result.error() << "glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_READ_ONLY) returned NULL";
		}

		if (buf)
		{
			result.sub_result(BufferCheck(dataRef, dataWidth, dataHeight, buf, dataWidth, dataHeight));

			result.sub_result(StateValidate<api>(GL_TRUE, GL_READ_ONLY, GL_MAP_READ_BIT, 0,
												 (GLsizeiptr)(dataRef.size() * sizeof(unsigned int))));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		buf = glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_WRITE_ONLY);
		if (buf == 0)
		{
			result.error() << "glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_WRITE_ONLY) returned NULL";
		}

		if (buf)
		{
			result.sub_result(BufferCheck(dataRef, dataWidth, dataHeight, buf, dataWidth, dataHeight));

			result.sub_result(StateValidate<api>(GL_TRUE, GL_WRITE_ONLY, GL_MAP_WRITE_BIT, 0,
												 (GLsizeiptr)(dataRef.size() * sizeof(unsigned int))));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) != GL_TRUE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		buf = glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_READ_WRITE);
		if (buf == 0)
		{
			result.error() << "glMapBuffer(GL_DRAW_INDIRECT_BUFFER, GL_READ_WRITE) returned NULL";
		}

		if (buf)
		{
			result.sub_result(BufferCheck(dataRef, dataWidth, dataHeight, buf, dataWidth, dataHeight));

			result.sub_result(StateValidate<api>(GL_TRUE, GL_READ_WRITE, GL_MAP_WRITE_BIT | GL_MAP_READ_BIT, 0,
												 (GLsizeiptr)(dataRef.size() * sizeof(unsigned int))));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		return result.code();
	}